

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_pre_smc_arm(CPUARMState *env,uint32_t syndrome)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  ArchCPU_conflict *cpu_00;
  uint64_t uVar6;
  bool bVar7;
  byte local_2d;
  _Bool smd;
  _Bool smd_flag;
  _Bool secure;
  int cur_el;
  ARMCPU *cpu;
  uint32_t syndrome_local;
  CPUARMState *env_local;
  
  cpu_00 = env_archcpu(env);
  iVar2 = arm_current_el(env);
  _Var1 = arm_is_secure(env);
  bVar7 = ((env->cp15).scr_el3 & 0x80) != 0;
  iVar3 = arm_feature(env,0x1c);
  if (iVar3 == 0) {
    local_2d = 0;
    if (bVar7) {
      local_2d = _Var1 ^ 0xff;
    }
    bVar7 = (bool)(local_2d & 1);
  }
  iVar3 = arm_feature(env,0x21);
  if ((iVar3 == 0) && (cpu_00->psci_conduit != 1)) {
    uVar4 = syn_uncategorized();
    uVar5 = exception_target_el(env);
    raise_exception_arm(env,1,uVar4,uVar5);
  }
  if ((iVar2 == 1) && (uVar6 = arm_hcr_el2_eff_arm(env), (uVar6 & 0x80000) != 0)) {
    raise_exception_arm(env,0xc,syndrome,2);
  }
  _Var1 = arm_is_psci_call_arm(cpu_00,0xd);
  if ((!_Var1) && ((bVar7 != false || (iVar2 = arm_feature(env,0x21), iVar2 == 0)))) {
    uVar4 = syn_uncategorized();
    uVar5 = exception_target_el(env);
    raise_exception_arm(env,1,uVar4,uVar5);
  }
  return;
}

Assistant:

void HELPER(pre_smc)(CPUARMState *env, uint32_t syndrome)
{
    ARMCPU *cpu = env_archcpu(env);
    int cur_el = arm_current_el(env);
    bool secure = arm_is_secure(env);
    bool smd_flag = env->cp15.scr_el3 & SCR_SMD;

    /*
     * SMC behaviour is summarized in the following table.
     * This helper handles the "Trap to EL2" and "Undef insn" cases.
     * The "Trap to EL3" and "PSCI call" cases are handled in the exception
     * helper.
     *
     *  -> ARM_FEATURE_EL3 and !SMD
     *                           HCR_TSC && NS EL1   !HCR_TSC || !NS EL1
     *
     *  Conduit SMC, valid call  Trap to EL2         PSCI Call
     *  Conduit SMC, inval call  Trap to EL2         Trap to EL3
     *  Conduit not SMC          Trap to EL2         Trap to EL3
     *
     *
     *  -> ARM_FEATURE_EL3 and SMD
     *                           HCR_TSC && NS EL1   !HCR_TSC || !NS EL1
     *
     *  Conduit SMC, valid call  Trap to EL2         PSCI Call
     *  Conduit SMC, inval call  Trap to EL2         Undef insn
     *  Conduit not SMC          Trap to EL2         Undef insn
     *
     *
     *  -> !ARM_FEATURE_EL3
     *                           HCR_TSC && NS EL1   !HCR_TSC || !NS EL1
     *
     *  Conduit SMC, valid call  Trap to EL2         PSCI Call
     *  Conduit SMC, inval call  Trap to EL2         Undef insn
     *  Conduit not SMC          Undef insn          Undef insn
     */

    /* On ARMv8 with EL3 AArch64, SMD applies to both S and NS state.
     * On ARMv8 with EL3 AArch32, or ARMv7 with the Virtualization
     *  extensions, SMD only applies to NS state.
     * On ARMv7 without the Virtualization extensions, the SMD bit
     * doesn't exist, but we forbid the guest to set it to 1 in scr_write(),
     * so we need not special case this here.
     */
    bool smd = arm_feature(env, ARM_FEATURE_AARCH64) ? smd_flag
                                                     : smd_flag && !secure;

    if (!arm_feature(env, ARM_FEATURE_EL3) &&
        cpu->psci_conduit != QEMU_PSCI_CONDUIT_SMC) {
        /* If we have no EL3 then SMC always UNDEFs and can't be
         * trapped to EL2. PSCI-via-SMC is a sort of ersatz EL3
         * firmware within QEMU, and we want an EL2 guest to be able
         * to forbid its EL1 from making PSCI calls into QEMU's
         * "firmware" via HCR.TSC, so for these purposes treat
         * PSCI-via-SMC as implying an EL3.
         * This handles the very last line of the previous table.
         */
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }

    if (cur_el == 1 && (arm_hcr_el2_eff(env) & HCR_TSC)) {
        /* In NS EL1, HCR controlled routing to EL2 has priority over SMD.
         * We also want an EL2 guest to be able to forbid its EL1 from
         * making PSCI calls into QEMU's "firmware" via HCR.TSC.
         * This handles all the "Trap to EL2" cases of the previous table.
         */
        raise_exception(env, EXCP_HYP_TRAP, syndrome, 2);
    }

    /* Catch the two remaining "Undef insn" cases of the previous table:
     *    - PSCI conduit is SMC but we don't have a valid PCSI call,
     *    - We don't have EL3 or SMD is set.
     */
    if (!arm_is_psci_call(cpu, EXCP_SMC) &&
        (smd || !arm_feature(env, ARM_FEATURE_EL3))) {
        raise_exception(env, EXCP_UDEF, syn_uncategorized(),
                        exception_target_el(env));
    }
}